

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelSensorsTransformers.cpp
# Opt level: O3

bool iDynTree::createReducedModelAndSensors
               (Model *fullModel,SensorsList *fullSensors,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *jointsInReducedModel,Model *reducedModel,SensorsList *reducedSensors)

{
  bool bVar1;
  SensorsList *pSVar2;
  Model fullModelCopy;
  Model local_160;
  
  Model::Model(&local_160,fullModel);
  pSVar2 = Model::sensors(&local_160);
  SensorsList::operator=(pSVar2,fullSensors);
  bVar1 = createReducedModel(&local_160,jointsInReducedModel,reducedModel);
  if (bVar1) {
    pSVar2 = Model::sensors(reducedModel);
    SensorsList::operator=(reducedSensors,pSVar2);
  }
  Model::~Model(&local_160);
  return bVar1;
}

Assistant:

bool createReducedModelAndSensors(const Model& fullModel,
                                  const SensorsList& fullSensors,
                                  const std::vector<std::string>& jointsInReducedModel,
                                        Model& reducedModel,
                                        SensorsList& reducedSensors)
{
    Model fullModelCopy = fullModel;
    fullModelCopy.sensors() = fullSensors;

    if (!createReducedModel(fullModelCopy, jointsInReducedModel, reducedModel)) {
        return false;
    }

    reducedSensors = reducedModel.sensors();

    return true;
}